

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::Promise<void>_> __thiscall
kj::anon_unknown_36::HttpClientAdapter::DelayedCloseWebSocket::tryPumpFrom
          (DelayedCloseWebSocket *this,WebSocket *other)

{
  RefOrVoid<kj::WebSocket> pWVar1;
  long *in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 extraout_RDX;
  Maybe<kj::Promise<void>_> MVar2;
  Promise<void> local_30;
  Promise<void> local_28 [2];
  WebSocket *other_local;
  DelayedCloseWebSocket *this_local;
  
  other_local = other;
  this_local = this;
  pWVar1 = Own<kj::WebSocket,_std::nullptr_t>::operator*
                     ((Own<kj::WebSocket,_std::nullptr_t> *)(other + 1));
  (**(code **)(*in_RDX + 0x38))(&local_30,in_RDX,pWVar1);
  Promise<void>::
  then<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket::tryPumpFrom(kj::WebSocket&)::_lambda()_1_>
            (local_28,(Type *)&local_30);
  Maybe<kj::Promise<void>_>::Maybe((Maybe<kj::Promise<void>_> *)this,local_28);
  Promise<void>::~Promise(local_28);
  Promise<void>::~Promise(&local_30);
  MVar2.ptr.field_1 = extraout_RDX;
  MVar2.ptr._0_8_ = this;
  return (Maybe<kj::Promise<void>_>)MVar2.ptr;
}

Assistant:

kj::Maybe<kj::Promise<void>> tryPumpFrom(WebSocket& other) override {
      return other.pumpTo(*inner).then([this]() {
        return afterSendClosed();
      });
    }